

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vic20.cpp
# Opt level: O1

void __thiscall
Commodore::Vic20::ConcreteMachine::set_key_state(ConcreteMachine *this,uint16_t key,bool is_pressed)

{
  element_type *peVar1;
  byte bVar2;
  byte bVar3;
  
  if (key < 0xfff0) {
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar2 = (byte)(key >> 3);
    bVar3 = peVar1->columns_[key & 7];
    if (is_pressed) {
      bVar3 = bVar3 & ~bVar2;
    }
    else {
      bVar3 = bVar3 | bVar2;
    }
    peVar1->columns_[key & 7] = bVar3;
    return;
  }
  switch(key) {
  case 0xfff0:
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->columns_[3] = !is_pressed * '\x02' | peVar1->columns_[3] & 0xfd;
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar3 = peVar1->columns_[3];
    if (is_pressed) {
      bVar3 = bVar3 & 0x7f;
    }
    else {
      bVar3 = bVar3 | 0x80;
    }
    peVar1->columns_[3] = bVar3;
    return;
  case 0xfff1:
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->columns_[3] = !is_pressed * '\x02' | peVar1->columns_[3] & 0xfd;
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar3 = peVar1->columns_[2];
    if (is_pressed) {
      bVar3 = bVar3 & 0x7f;
    }
    else {
      bVar3 = bVar3 | 0x80;
    }
    peVar1->columns_[2] = bVar3;
    return;
  case 0xfff2:
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->columns_[3] = !is_pressed * '\x02' | peVar1->columns_[3] & 0xfd;
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar3 = peVar1->columns_[4];
    if (is_pressed) {
      bVar3 = bVar3 & 0x7f;
    }
    else {
      bVar3 = bVar3 | 0x80;
    }
    peVar1->columns_[4] = bVar3;
    return;
  case 0xfff3:
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->columns_[3] = !is_pressed * '\x02' | peVar1->columns_[3] & 0xfd;
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar3 = peVar1->columns_[5];
    if (is_pressed) {
      bVar3 = bVar3 & 0x7f;
    }
    else {
      bVar3 = bVar3 | 0x80;
    }
    peVar1->columns_[5] = bVar3;
    return;
  case 0xfff4:
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->columns_[3] = !is_pressed * '\x02' | peVar1->columns_[3] & 0xfd;
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar3 = peVar1->columns_[6];
    if (is_pressed) {
      bVar3 = bVar3 & 0x7f;
    }
    else {
      bVar3 = bVar3 | 0x80;
    }
    peVar1->columns_[6] = bVar3;
    return;
  case 0xfff5:
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->columns_[3] = !is_pressed * '\x02' | peVar1->columns_[3] & 0xfd;
    peVar1 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar3 = peVar1->columns_[7];
    if (is_pressed) {
      bVar3 = bVar3 & 0x7f;
    }
    else {
      bVar3 = bVar3 | 0x80;
    }
    peVar1->columns_[7] = bVar3;
    break;
  case 0xfffd:
    MOS::MOS6522::MOS6522<Commodore::Vic20::UserPortVIA>::set_control_line_input
              (&this->user_port_via_,A,One,!is_pressed);
    return;
  }
  return;
}

Assistant:

void set_key_state(uint16_t key, bool is_pressed) final {
			if(key < 0xfff0) {
				keyboard_via_port_handler_->set_key_state(key, is_pressed);
			} else {
				switch(key) {
					case KeyRestore:
						user_port_via_.set_control_line_input(MOS::MOS6522::Port::A, MOS::MOS6522::Line::One, !is_pressed);
					break;
#define ShiftedMap(source, target)	\
					case source:	\
						keyboard_via_port_handler_->set_key_state(KeyLShift, is_pressed);	\
						keyboard_via_port_handler_->set_key_state(target, is_pressed);	\
					break;

					ShiftedMap(KeyUp, KeyDown);
					ShiftedMap(KeyLeft, KeyRight);
					ShiftedMap(KeyF2, KeyF1);
					ShiftedMap(KeyF4, KeyF3);
					ShiftedMap(KeyF6, KeyF5);
					ShiftedMap(KeyF8, KeyF7);
#undef ShiftedMap
				}
			}
		}